

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  u32 *puVar1;
  long lVar2;
  u16 *puVar3;
  char **ppcVar4;
  Schema *pSVar5;
  sqlite3_vtab *psVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  VtabCtx *pVVar10;
  VTable *pVTab;
  long lVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  uint uVar16;
  Schema **ppSVar17;
  long lVar18;
  char *zRight;
  uint uVar19;
  long in_FS_OFFSET;
  char *zErr;
  char *local_60;
  VtabCtx local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.pPrior = (VtabCtx *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.bDeclared = -0x55555556;
  local_58._28_4_ = 0xaaaaaaaa;
  local_58.pVTable = (VTable *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
  iVar9 = (pTab->u).tab.addColOffset;
  local_60 = (char *)0x0;
  ppcVar4 = (pTab->u).vtab.azArg;
  for (pVVar10 = db->pVtabCtx; pVVar10 != (VtabCtx *)0x0; pVVar10 = pVVar10->pPrior) {
    if (pVVar10->pTab == pTab) {
      pcVar12 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar12;
      iVar8 = 6;
      goto LAB_0015eb9e;
    }
  }
  pcVar12 = sqlite3DbStrDup(db,pTab->zName);
  iVar8 = 7;
  if (pcVar12 == (char *)0x0) goto LAB_0015eb9e;
  pVTab = (VTable *)sqlite3Malloc(0x30);
  if (pVTab == (VTable *)0x0) {
    sqlite3OomFault(db);
    iVar8 = 7;
  }
  else {
    pVTab->db = (sqlite3 *)0x0;
    pVTab->pMod = (Module *)0x0;
    pVTab->pVtab = (sqlite3_vtab *)0x0;
    pVTab->nRef = 0;
    pVTab->bConstraint = '\0';
    pVTab->bAllSchemas = '\0';
    pVTab->eVtabRisk = '\0';
    pVTab->field_0x1f = 0;
    *(undefined8 *)&pVTab->iSavepoint = 0;
    pVTab->pNext = (VTable *)0x0;
    pVTab->db = db;
    pVTab->pMod = pMod;
    pVTab->eVtabRisk = '\x01';
    if (pTab->pSchema == (Schema *)0x0) {
      lVar11 = -0x8000;
    }
    else {
      lVar11 = -0x100000000;
      ppSVar17 = &db->aDb->pSchema;
      do {
        lVar11 = lVar11 + 0x100000000;
        pSVar5 = *ppSVar17;
        ppSVar17 = ppSVar17 + 4;
      } while (pSVar5 != pTab->pSchema);
      lVar11 = lVar11 >> 0x20;
    }
    ((pTab->u).tab.pFKey)->pNextFrom = (FKey *)db->aDb[lVar11].zDbSName;
    local_58.pPrior = db->pVtabCtx;
    local_58.bDeclared = 0;
    db->pVtabCtx = &local_58;
    pTab->nTabRef = pTab->nTabRef + 1;
    local_58.pVTable = pVTab;
    local_58.pTab = pTab;
    iVar8 = (*xConstruct)(db,pMod->pAux,iVar9,ppcVar4,&pVTab->pVtab,&local_60);
    if (db->pnBytesFreed == (int *)0x0) {
      puVar1 = &pTab->nTabRef;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) goto LAB_0015e975;
    }
    else {
LAB_0015e975:
      deleteTable(db,pTab);
    }
    db->pVtabCtx = local_58.pPrior;
    if (iVar8 == 0) {
      psVar6 = pVTab->pVtab;
      iVar8 = 0;
      if (psVar6 != (sqlite3_vtab *)0x0) {
        psVar6->pModule = (sqlite3_module *)0x0;
        *(undefined8 *)&psVar6->nRef = 0;
        psVar6->zErrMsg = (char *)0x0;
        pVTab->pVtab->pModule = pMod->pModule;
        pMod->nRefModule = pMod->nRefModule + 1;
        pVTab->nRef = 1;
        if (local_58.bDeclared == 0) {
          pcVar13 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pcVar12);
          *pzErr = pcVar13;
          sqlite3VtabUnlock(pVTab);
          iVar8 = 1;
        }
        else {
          pVTab->pNext = (VTable *)(pTab->u).tab.pDfltList;
          (pTab->u).vtab.p = pVTab;
          if (0 < pTab->nCol) {
            lVar11 = 0;
            uVar7 = 0;
            do {
              pcVar13 = sqlite3ColumnType(pTab->aCol + lVar11,"");
              uVar19 = 0;
              if (pcVar13 != (char *)0x0) {
                sVar14 = strlen(pcVar13);
                uVar19 = (uint)sVar14 & 0x3fffffff;
              }
              if (uVar19 != 0) {
                lVar18 = 0;
                zRight = pcVar13;
LAB_0015ea9e:
                iVar9 = sqlite3_strnicmp("hidden",zRight,6);
                if ((iVar9 != 0) ||
                   (((lVar18 != 0 && (zRight[-1] != ' ')) || ((zRight[6] & 0xdfU) != 0))))
                goto LAB_0015eac9;
                uVar16 = 7 - (zRight[6] == 0);
                if (uVar16 - (int)lVar18 <= uVar19) {
                  lVar15 = -lVar18;
                  do {
                    pcVar13[lVar15] = pcVar13[lVar15 + (ulong)uVar16];
                    lVar2 = (ulong)uVar16 + lVar15;
                    lVar15 = lVar15 + 1;
                  } while (lVar2 + 1U <= (ulong)uVar19);
                }
                if ((lVar18 != 0) && (*zRight == '\0')) {
                  zRight[-1] = '\0';
                }
                puVar3 = &pTab->aCol[lVar11].colFlags;
                *puVar3 = *puVar3 | 2;
                uVar7 = 0x400;
                uVar19 = 2;
                goto LAB_0015eb45;
              }
LAB_0015ead4:
              uVar19 = (uint)uVar7;
LAB_0015eb45:
              pTab->tabFlags = pTab->tabFlags | uVar19;
              lVar11 = lVar11 + 1;
            } while (lVar11 < pTab->nCol);
            iVar8 = 0;
          }
        }
      }
    }
    else {
      if (iVar8 == 7) {
        sqlite3OomFault(db);
      }
      if (local_60 == (char *)0x0) {
        pcVar13 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar12);
        *pzErr = pcVar13;
      }
      else {
        pcVar13 = sqlite3MPrintf(db,"%s");
        *pzErr = pcVar13;
        sqlite3_free(local_60);
      }
      sqlite3DbFreeNN(db,pVTab);
    }
  }
  sqlite3DbFreeNN(db,pcVar12);
LAB_0015eb9e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
LAB_0015eac9:
  lVar18 = lVar18 + -1;
  zRight = zRight + 1;
  if (-lVar18 == (ulong)uVar19) goto LAB_0015ead4;
  goto LAB_0015ea9e;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db,
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg;
  int nArg = pTab->u.vtab.nArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  assert( IsVirtual(pTab) );
  azArg = (const char *const*)pTab->u.vtab.azArg;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db,
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;
  pVTable->eVtabRisk = SQLITE_VTABRISK_Normal;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->u.vtab.azArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  pTab->nTabRef++;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  assert( pTab!=0 );
  assert( pTab->nTabRef>1 || rc!=SQLITE_OK );
  sqlite3DeleteTable(db, pTab);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pMod->nRefModule++;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, zModuleName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u16 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->u.vtab.p. Then loop through the
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->u.vtab.p;
      pTab->u.vtab.p = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          pTab->tabFlags |= TF_HasHidden;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}